

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void chebyshev1_compute(int n,double *x,double *w)

{
  ostream *poVar1;
  double dVar2;
  double r8_pi;
  int i;
  double *w_local;
  double *x_local;
  int n_local;
  
  if (n < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"CHEBYSHEV1_COMPUTE - Fatal error!\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal value of N = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    std::operator<<(poVar1,"\n");
    exit(1);
  }
  for (r8_pi._4_4_ = 0; r8_pi._4_4_ < n; r8_pi._4_4_ = r8_pi._4_4_ + 1) {
    w[r8_pi._4_4_] = 3.141592653589793 / (double)n;
  }
  for (r8_pi._4_4_ = 0; r8_pi._4_4_ < n; r8_pi._4_4_ = r8_pi._4_4_ + 1) {
    dVar2 = cos(((double)(n * 2 + -1 + r8_pi._4_4_ * -2) * 3.141592653589793) / (double)(n << 1));
    x[r8_pi._4_4_] = dVar2;
  }
  return;
}

Assistant:

void chebyshev1_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBYSHEV1_COMPUTE computes a Gauss-Chebyshev type 1 quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) F(X) / sqrt ( 1 - x^2 ) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= N ) W(I) * F ( X(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    26 February 2008
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//  Parameters:
//
//    Input, int N, the order.
//    N must be greater than 0.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;
  const double r8_pi = 3.141592653589793;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "CHEBYSHEV1_COMPUTE - Fatal error!\n";
    std::cerr << "  Illegal value of N = " << n << "\n";
    exit ( 1 );
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = r8_pi / double( n );
  }
  for ( i = 0; i < n; i++ )
  {
    x[i] = cos ( r8_pi * double( 2 * n - 1 - 2 * i ) 
                       / double( 2 * n ) );
  }

  return;
}